

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::buildCFGViews(BaseRAPass *this)

{
  ZoneAllocator *allocator;
  uint32_t n;
  RABlock *pRVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Error EVar5;
  RABlock **ppRVar6;
  BaseBuilder *pBVar7;
  uint uVar8;
  ulong i;
  undefined1 *puVar9;
  BaseRAPass *this_00;
  Logger *this_01;
  long lVar10;
  float in_XMM0_Da;
  RABlockVisitItem RVar11;
  RABlock *local_4a8;
  Logger *local_4a0;
  ZoneAllocator *local_498;
  ZoneVector<asmjit::v1_14::RABlock_*> *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> stack;
  undefined1 local_458 [32];
  undefined1 local_438 [1032];
  
  if ((this->_diagnosticOptions & kRADebugCFG) == kNone) {
    this_01 = (Logger *)0x0;
  }
  else {
    this_01 = this->_logger;
  }
  if (this_01 != (Logger *)0x0) {
    Logger::logf(this_01,in_XMM0_Da);
  }
  n = *(uint32_t *)&this->field_0xb8;
  if (n == 0) {
    EVar5 = 0;
  }
  else {
    allocator = &this->_allocator;
    EVar5 = ZoneVector<asmjit::v1_14::RABlock_*>::reserve(&this->_pov,allocator,n);
    if (EVar5 == 0) {
      stack.super_ZoneStackBase = (ZoneStackBase)0x0;
      stack._1_7_ = 0;
      stack._8_8_ = 0;
      stack._16_8_ = 0;
      local_490 = &this->_pov;
      EVar5 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::init(&stack,(EVP_PKEY_CTX *)allocator);
      if (EVar5 == 0) {
        local_488 = 0;
        uStack_480 = 0;
        uVar8 = 0;
        EVar5 = ZoneBitVector::_resize((ZoneBitVector *)&local_488,allocator,n,n,false);
        if (EVar5 == 0) {
          local_4a0 = this_01;
          local_498 = allocator;
          ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[](&this->_blocks,0);
          local_4a8 = *ppRVar6;
LAB_001207a2:
          while( true ) {
            if (uVar8 < *(uint *)(local_4a8 + 0x70)) goto code_r0x001207a8;
            local_4a8[0xc] = (RABlock)((byte)local_4a8[0xc] | 2);
            *(undefined4 *)(local_4a8 + 0x2c) = *(undefined4 *)&this->field_0xd8;
            ZoneVector<asmjit::v1_14::RABlock_*>::appendUnsafe(local_490,&local_4a8);
            bVar4 = ZoneStackBase::empty(&stack.super_ZoneStackBase);
            if (bVar4) break;
            RVar11 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
                               ((ZoneStack<asmjit::v1_14::RABlockVisitItem> *)
                                &stack.super_ZoneStackBase);
            local_4a8 = RVar11._block;
            uVar8 = RVar11._index;
          }
          if (local_4a0 != (Logger *)0x0) {
            local_458._24_8_ = local_438;
            local_458._8_8_ = (BaseBuilder *)0x0;
            local_458._0_8_ = (_func_int **)0x20;
            local_458._16_8_ = (char *)0x407;
            local_438[0] = 0;
            lVar2 = *(long *)&this->_blocks;
            uVar8 = *(uint *)&this->field_0xb8;
            for (lVar10 = 0; (ulong)uVar8 << 3 != lVar10; lVar10 = lVar10 + 8) {
              lVar3 = *(long *)(lVar2 + lVar10);
              String::clear((String *)local_458);
              if (*(int *)(lVar3 + 0x70) == 0) {
                String::_opFormat((String *)local_458,kAppend,"  #%u -> {Exit}\n",
                                  (ulong)*(uint *)(lVar3 + 8));
              }
              else {
                this_00 = (BaseRAPass *)local_458;
                String::_opFormat((String *)local_458,kAppend,"  #%u -> {",
                                  (ulong)*(uint *)(lVar3 + 8));
                _dumpBlockIds(this_00,(String *)local_458,(RABlocks *)(lVar3 + 0x68));
                String::_opString((String *)local_458,kAppend,"}\n",0xffffffffffffffff);
              }
              pBVar7 = (BaseBuilder *)(local_458._0_8_ & 0xff);
              puVar9 = local_458 + 1;
              if ((BaseBuilder *)0x1e < (BaseBuilder *)(local_458._0_8_ & 0xff)) {
                pBVar7 = (BaseBuilder *)local_458._8_8_;
                puVar9 = (undefined1 *)local_458._24_8_;
              }
              (*local_4a0->_vptr_Logger[2])(local_4a0,puVar9,pBVar7);
            }
            String::reset((String *)local_458);
          }
          ZoneBitVector::release((ZoneBitVector *)&local_488,local_498);
          EVar5 = 0;
        }
      }
LAB_0012083e:
      ZoneStackBase::_init(&stack.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
    }
  }
  return EVar5;
code_r0x001207a8:
  i = (ulong)uVar8;
  uVar8 = uVar8 + 1;
  ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                      ((ZoneVector<asmjit::v1_14::RABlock_*> *)(local_4a8 + 0x68),i);
  pRVar1 = *ppRVar6;
  bVar4 = ZoneBitVector::bitAt((ZoneBitVector *)&local_488,*(uint32_t *)(pRVar1 + 8));
  if (!bVar4) {
    ZoneBitVector::setBit((ZoneBitVector *)&local_488,*(uint32_t *)(pRVar1 + 8),true);
    RVar11._index = uVar8;
    RVar11._block = local_4a8;
    RVar11._12_4_ = 0;
    EVar5 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::append
                      ((ZoneStack<asmjit::v1_14::RABlockVisitItem> *)&stack.super_ZoneStackBase,
                       RVar11);
    if (EVar5 == 0) {
      uVar8 = 0;
      local_4a8 = pRVar1;
      goto LAB_001207a2;
    }
    goto LAB_0012083e;
  }
  goto LAB_001207a2;
}

Assistant:

Error BaseRAPass::buildCFGViews() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugCFG);
  ASMJIT_RA_LOG_FORMAT("[BuildCFGViews]\n");
#endif

  uint32_t count = blockCount();
  if (ASMJIT_UNLIKELY(!count)) return kErrorOk;

  ASMJIT_PROPAGATE(_pov.reserve(allocator(), count));

  ZoneStack<RABlockVisitItem> stack;
  ASMJIT_PROPAGATE(stack.init(allocator()));

  ZoneBitVector visited;
  ASMJIT_PROPAGATE(visited.resize(allocator(), count));

  RABlock* current = _blocks[0];
  uint32_t i = 0;

  for (;;) {
    for (;;) {
      if (i >= current->successors().size())
        break;

      // Skip if already visited.
      RABlock* child = current->successors()[i++];
      if (visited.bitAt(child->blockId()))
        continue;

      // Mark as visited to prevent visiting the same block multiple times.
      visited.setBit(child->blockId(), true);

      // Add the current block on the stack, we will get back to it later.
      ASMJIT_PROPAGATE(stack.append(RABlockVisitItem(current, i)));
      current = child;
      i = 0;
    }

    current->makeReachable();
    current->_povOrder = _pov.size();
    _pov.appendUnsafe(current);

    if (stack.empty())
      break;

    RABlockVisitItem top = stack.pop();
    current = top.block();
    i = top.index();
  }

  ASMJIT_RA_LOG_COMPLEX({
    StringTmp<1024> sb;
    for (RABlock* block : blocks()) {
      sb.clear();
      if (block->hasSuccessors()) {
        sb.appendFormat("  #%u -> {", block->blockId());
        _dumpBlockIds(sb, block->successors());
        sb.append("}\n");
      }
      else {
        sb.appendFormat("  #%u -> {Exit}\n", block->blockId());
      }
      logger->log(sb);
    }
  });

  visited.release(allocator());
  return kErrorOk;
}